

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

VALUE_TYPE Diligent::ComponentTypeToValueType(COMPONENT_TYPE CompType,Uint32 Size)

{
  VALUE_TYPE VVar1;
  ulong uVar2;
  byte bVar3;
  undefined3 in_register_00000039;
  
  switch(CONCAT31(in_register_00000039,CompType)) {
  case 0:
    return CompType;
  case 1:
    if (Size - 2 < 7) {
      bVar3 = (char)(Size - 2) * '\b';
      uVar2 = 0x9000000080007;
LAB_0050a234:
      return (VALUE_TYPE)(uVar2 >> (bVar3 & 0x3f));
    }
    break;
  case 2:
    VVar1 = (Size == 2) * '\x02';
    if (Size == 1) {
      VVar1 = VT_INT8;
    }
    return VVar1;
  case 3:
    VVar1 = VT_UINT8;
    if (Size != 1) {
      VVar1 = (Size == 2) * '\x05';
    }
    return VVar1;
  case 4:
    return (Size == 1) << 2;
  case 5:
    if (Size < 5) {
      bVar3 = (byte)(Size << 3);
      uVar2 = 0x300020100;
      goto LAB_0050a234;
    }
    break;
  case 6:
    if (Size < 5) {
      bVar3 = (byte)(Size << 3);
      uVar2 = 0x600050400;
      goto LAB_0050a234;
    }
    break;
  case 7:
    return (Size == 4) << 3;
  }
  return VT_UNDEFINED;
}

Assistant:

VALUE_TYPE ComponentTypeToValueType(COMPONENT_TYPE CompType, Uint32 Size)
{
    switch (CompType)
    {
        case COMPONENT_TYPE_UNDEFINED:
            return VT_UNDEFINED;

        case COMPONENT_TYPE_FLOAT:
            switch (Size)
            {
                case 2: return VT_FLOAT16;
                case 4: return VT_FLOAT32;
                case 8: return VT_FLOAT64;
            }
            break;

        case COMPONENT_TYPE_SNORM:
            switch (Size)
            {
                case 1: return VT_INT8;
                case 2: return VT_INT16;
            }
            break;

        case COMPONENT_TYPE_UNORM:
            switch (Size)
            {
                case 1: return VT_UINT8;
                case 2: return VT_UINT16;
            }
            break;

        case COMPONENT_TYPE_UNORM_SRGB:
            return Size == 1 ? VT_UINT8 : VT_UNDEFINED;

        case COMPONENT_TYPE_SINT:
            switch (Size)
            {
                case 1: return VT_INT8;
                case 2: return VT_INT16;
                case 4: return VT_INT32;
            }
            break;

        case COMPONENT_TYPE_UINT:
            switch (Size)
            {
                case 1: return VT_UINT8;
                case 2: return VT_UINT16;
                case 4: return VT_UINT32;
            }
            break;

        case COMPONENT_TYPE_DEPTH:
            return Size == 4 ? VT_FLOAT32 : VT_UNDEFINED;

        default:
            break;
    }

    return VT_UNDEFINED;
}